

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

tss_data_node * boost::detail::find_tss_data(void *key)

{
  thread_data_base *ptVar1;
  iterator iVar2;
  tss_data_node *ptVar3;
  key_type local_10;
  
  ptVar1 = get_current_thread_data();
  if (ptVar1 == (thread_data_base *)0x0) {
    ptVar3 = (tss_data_node *)0x0;
  }
  else {
    iVar2 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_boost::detail::tss_data_node>,_std::_Select1st<std::pair<const_void_*const,_boost::detail::tss_data_node>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
            ::find(&(ptVar1->tss_data)._M_t,&local_10);
    ptVar3 = (tss_data_node *)0x0;
    if ((_Rb_tree_header *)iVar2._M_node != &(ptVar1->tss_data)._M_t._M_impl.super__Rb_tree_header)
    {
      ptVar3 = (tss_data_node *)&iVar2._M_node[1]._M_parent;
    }
  }
  return ptVar3;
}

Assistant:

tss_data_node* find_tss_data(void const* key)
        {
            detail::thread_data_base* const current_thread_data(get_current_thread_data());
            if(current_thread_data)
            {
                std::map<void const*,tss_data_node>::iterator current_node=
                    current_thread_data->tss_data.find(key);
                if(current_node!=current_thread_data->tss_data.end())
                {
                    return &current_node->second;
                }
            }
            return 0;
        }